

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# azure_base64.c
# Opt level: O1

STRING_HANDLE Base64_Encode_Internal(uchar *source,size_t size)

{
  ulong uVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  long lVar5;
  char *pcVar6;
  LOGGER_LOG p_Var7;
  STRING_HANDLE pSVar8;
  byte bVar9;
  int iVar10;
  ulong uVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  size_t sVar15;
  size_t __size;
  
  if (size == 0) {
    lVar5 = 0;
  }
  else if (size < 0xbffffffffffffffe) {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = size - 1;
    lVar5 = (SUB168(auVar3 * ZEXT816(0xaaaaaaaaaaaaaaab),8) & 0xfffffffffffffffe) * 2 + 4;
  }
  else {
    lVar5 = -(ulong)(0xbffffffffffffffd < size);
  }
  __size = 0xffffffffffffffff;
  if (lVar5 + 1U != 0) {
    __size = lVar5 + 1U;
  }
  if (__size == 0xffffffffffffffff) {
    p_Var7 = xlogging_get_log_function();
    if (p_Var7 == (LOGGER_LOG)0x0) {
      return (STRING_HANDLE)0x0;
    }
    pcVar6 = "Azure_Base64_Encode:: Invalid size parameter, neededSize:%zu.";
    iVar10 = 0xf9;
    goto LAB_00178918;
  }
  pcVar6 = (char *)malloc(__size);
  if (pcVar6 == (char *)0x0) {
    p_Var7 = xlogging_get_log_function();
    if (p_Var7 == (LOGGER_LOG)0x0) {
      return (STRING_HANDLE)0x0;
    }
    pcVar6 = "Azure_Base64_Encode:: Allocation failed.";
    iVar10 = 0xff;
    goto LAB_00178918;
  }
  bVar4 = false;
  uVar11 = 0;
  lVar5 = 0;
  sVar15 = size;
  do {
    if (sVar15 < 3) break;
    bVar14 = source[lVar5];
    bVar9 = bVar14 >> 2;
    if (bVar14 < 0x68) {
      bVar9 = bVar9 + 0x41;
    }
    else if (bVar14 < 0xd0) {
      bVar9 = bVar9 + 0x47;
    }
    else if (bVar14 < 0xf8) {
      bVar9 = bVar9 - 4;
    }
    else {
      bVar9 = (bVar9 != 0x3e) << 2 | 0x2b;
    }
    bVar14 = (bVar14 & 3) << 4 | source[lVar5 + 1] >> 4;
    if (bVar14 < 0x1a) {
      bVar14 = bVar14 + 0x41;
    }
    else if (bVar14 < 0x34) {
      bVar14 = bVar14 + 0x47;
    }
    else if (bVar14 < 0x3e) {
      bVar14 = bVar14 - 4;
    }
    else {
      bVar14 = (bVar14 != 0x3e) << 2 | 0x2b;
    }
    bVar13 = source[lVar5 + 1] << 2;
    bVar12 = source[lVar5 + 2] >> 6 | bVar13 & 0x3f;
    if (bVar12 < 0x1a) {
      bVar12 = bVar12 + 0x41;
    }
    else if ((bVar13 & 0x3c) < 0x34) {
      bVar12 = bVar12 + 0x47;
    }
    else if (bVar12 < 0x3e) {
      bVar12 = bVar12 - 4;
    }
    else {
      bVar12 = (bVar12 != 0x3e) << 2 | 0x2b;
    }
    bVar13 = source[lVar5 + 2] & 0x3f;
    if (bVar13 < 0x1a) {
      bVar13 = bVar13 + 0x41;
    }
    else if (bVar13 < 0x34) {
      bVar13 = bVar13 + 0x47;
    }
    else if (bVar13 < 0x3e) {
      bVar13 = bVar13 - 4;
    }
    else {
      bVar13 = (bVar13 != 0x3e) << 2 | 0x2b;
    }
    uVar1 = uVar11 + 4;
    if (__size < uVar1) {
      p_Var7 = xlogging_get_log_function();
      bVar4 = true;
      if (p_Var7 != (LOGGER_LOG)0x0) {
        (*p_Var7)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/azure_base64.c"
                  ,"Base64_Encode_Internal",0x11b,1,"Azure_Base64_Encode:: Invalid buffer size.");
      }
    }
    else {
      pcVar6[uVar11] = bVar9;
      pcVar6[uVar11 + 1] = bVar14;
      pcVar6[uVar11 + 2] = bVar12;
      pcVar6[uVar11 + 3] = bVar13;
      uVar11 = uVar1;
    }
    sVar15 = sVar15 - 3;
    lVar5 = lVar5 + 3;
  } while (uVar1 <= __size);
  if (size - lVar5 == 2 && !bVar4) {
    if (__size < uVar11 + 4) {
      p_Var7 = xlogging_get_log_function();
      if (p_Var7 != (LOGGER_LOG)0x0) {
        iVar10 = 0x12a;
LAB_00178758:
        (*p_Var7)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/azure_base64.c"
                  ,"Base64_Encode_Internal",iVar10,1,"Azure_Base64_Encode:: Invalid buffer size.");
      }
LAB_00178763:
      bVar4 = true;
    }
    else {
      bVar14 = source[lVar5];
      bVar9 = bVar14 >> 2;
      if (bVar14 < 0x68) {
        bVar9 = bVar9 + 0x41;
      }
      else if (bVar14 < 0xd0) {
        bVar9 = bVar9 + 0x47;
      }
      else if (bVar14 < 0xf8) {
        bVar9 = bVar9 - 4;
      }
      else {
        bVar9 = (bVar9 != 0x3e) << 2 | 0x2b;
      }
      bVar12 = source[lVar5 + 1];
      bVar14 = (bVar14 & 3) << 4 | bVar12 >> 4;
      if (bVar14 < 0x1a) {
        bVar14 = bVar14 + 0x41;
      }
      else if (bVar14 < 0x34) {
        bVar14 = bVar14 + 0x47;
      }
      else if (bVar14 < 0x3e) {
        bVar14 = bVar14 - 4;
      }
      else {
        bVar14 = (bVar14 != 0x3e) << 2 | 0x2b;
      }
      uVar2 = *(uint *)(&DAT_001b5140 + (bVar12 & 0xc));
      pcVar6[uVar11] = bVar9;
      pcVar6[uVar11 + 1] = bVar14;
      pcVar6[uVar11 + 2] = (char)(uVar2 >> ((bVar12 & 3) << 3));
      pcVar6[uVar11 + 3] = '=';
      uVar11 = uVar11 + 4;
    }
  }
  else if (size - lVar5 == 1 && !bVar4) {
    if (__size < uVar11 + 4) {
      p_Var7 = xlogging_get_log_function();
      if (p_Var7 != (LOGGER_LOG)0x0) {
        iVar10 = 0x13f;
        goto LAB_00178758;
      }
      goto LAB_00178763;
    }
    bVar14 = source[lVar5];
    bVar9 = bVar14 >> 2;
    if (bVar14 < 0x68) {
      bVar9 = bVar9 + 0x41;
    }
    else if (bVar14 < 0xd0) {
      bVar9 = bVar9 + 0x47;
    }
    else if (bVar14 < 0xf8) {
      bVar9 = bVar9 - 4;
    }
    else {
      bVar9 = (bVar9 != 0x3e) << 2 | 0x2b;
    }
    pcVar6[uVar11] = bVar9;
    pcVar6[uVar11 + 1] = (char)(0x77675141 >> ((bVar14 & 3) << 3));
    (pcVar6 + uVar11 + 2)[0] = '=';
    (pcVar6 + uVar11 + 2)[1] = '=';
    uVar11 = uVar11 + 4;
  }
  if (!bVar4) {
    if (__size < uVar11 + 1) {
      p_Var7 = xlogging_get_log_function();
      bVar4 = true;
      if (p_Var7 != (LOGGER_LOG)0x0) {
        (*p_Var7)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/azure_base64.c"
                  ,"Base64_Encode_Internal",0x152,1,"Azure_Base64_Encode:: Invalid buffer size.");
      }
    }
    else {
      pcVar6[uVar11] = '\0';
    }
  }
  if (bVar4) {
    free(pcVar6);
  }
  else {
    pSVar8 = STRING_new_with_memory(pcVar6);
    if (pSVar8 != (STRING_HANDLE)0x0) {
      return pSVar8;
    }
    free(pcVar6);
    p_Var7 = xlogging_get_log_function();
    if (p_Var7 != (LOGGER_LOG)0x0) {
      pcVar6 = "Azure_Base64_Encode:: Allocation failed for return value.";
      iVar10 = 0x167;
LAB_00178918:
      (*p_Var7)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/azure_base64.c"
                ,"Base64_Encode_Internal",iVar10,1,pcVar6);
      return (STRING_HANDLE)0x0;
    }
  }
  return (STRING_HANDLE)0x0;
}

Assistant:

static STRING_HANDLE Base64_Encode_Internal(const unsigned char* source, size_t size)
{
    STRING_HANDLE result;
    size_t neededSize = 0;
    bool isBufferOverflow = false;
    char* encoded;
    size_t currentPosition = 0;
    neededSize = safe_add_size_t(neededSize, (size == 0) ? (0) : safe_multiply_size_t(safe_add_size_t(((safe_subtract_size_t(size, 1)) / 3), 1), 4));
    neededSize = safe_add_size_t(neededSize, 1);  /*+1 because \0 at the end of the string*/

    if (neededSize == 0 || neededSize == SIZE_MAX)
    {
        result = NULL;
        LogError("Azure_Base64_Encode:: Invalid size parameter, neededSize:%zu.", neededSize);
    }
    /*Codes_SRS_BASE64_06_006: [If when allocating memory to produce the encoding a failure occurs then Azure_Base64_Encode shall return NULL.]*/
    else if ((encoded = (char*)malloc(neededSize)) == NULL)
    {
        result = NULL;
        LogError("Azure_Base64_Encode:: Allocation failed.");
    }
    else
    {
        /*b0            b1(+1)          b2(+2)
        7 6 5 4 3 2 1 0 7 6 5 4 3 2 1 0 7 6 5 4 3 2 1 0
        |----c1---| |----c2---| |----c3---| |----c4---|
        */

        size_t destinationPosition = 0;
        while (size - currentPosition >= 3)
        {
            char c1 = base64char(source[currentPosition] >> 2);
            char c2 = base64char(
                ((source[currentPosition] & 3) << 4) |
                    (source[currentPosition + 1] >> 4)
            );
            char c3 = base64char(
                ((source[currentPosition + 1] & 0x0F) << 2) |
                    ((source[currentPosition + 2] >> 6) & 3)
            );
            char c4 = base64char(
                source[currentPosition + 2] & 0x3F
            );
            currentPosition += 3;

            if ((destinationPosition + 4) > neededSize)
            {
                LogError("Azure_Base64_Encode:: Invalid buffer size.");
                isBufferOverflow = true;
                break;
            }
            encoded[destinationPosition++] = c1;
            encoded[destinationPosition++] = c2;
            encoded[destinationPosition++] = c3;
            encoded[destinationPosition++] = c4;

        }

        if (!isBufferOverflow && size - currentPosition == 2)
        {
            if ((destinationPosition + 4) > neededSize)
            {
                LogError("Azure_Base64_Encode:: Invalid buffer size.");
                isBufferOverflow = true;
            }
            else
            {
                char c1 = base64char(source[currentPosition] >> 2);
                char c2 = base64char(
                    ((source[currentPosition] & 0x03) << 4) |
                    (source[currentPosition + 1] >> 4)
                );
                char c3 = base64b16(source[currentPosition + 1] & 0x0F);
                encoded[destinationPosition++] = c1;
                encoded[destinationPosition++] = c2;
                encoded[destinationPosition++] = c3;
                encoded[destinationPosition++] = '=';
            }
        }
        else if (!isBufferOverflow && size - currentPosition == 1)
        {
            if ((destinationPosition + 4) > neededSize)
            {
                LogError("Azure_Base64_Encode:: Invalid buffer size.");
                isBufferOverflow = true;
            }
            else
            {
                char c1 = base64char(source[currentPosition] >> 2);
                char c2 = base64b8(source[currentPosition] & 0x03);
                encoded[destinationPosition++] = c1;
                encoded[destinationPosition++] = c2;
                encoded[destinationPosition++] = '=';
                encoded[destinationPosition++] = '=';
            }
        }

        /*null terminating the string*/
        if (!isBufferOverflow)
        {
            if ((destinationPosition + 1) > neededSize)
            {
                LogError("Azure_Base64_Encode:: Invalid buffer size.");
                isBufferOverflow = true;
            }
            else
            {
                encoded[destinationPosition] = '\0';
            }
        }

        if (isBufferOverflow)
        {
            free(encoded);
            result = NULL;
        }
        else
        {
            /*Codes_SRS_BASE64_06_007: [Otherwise Azure_Base64_Encode shall return a pointer to STRING, that string contains the base 64 encoding of input.]*/
            result = STRING_new_with_memory(encoded);
            if (result == NULL)
            {
                free(encoded);
                LogError("Azure_Base64_Encode:: Allocation failed for return value.");
            }
        }
    }
    return result;
}